

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::NegativeGLSL::Run(NegativeGLSL *this)

{
  GLuint GVar1;
  int local_2c;
  char *pcStack_28;
  GLint status;
  char *glsl_fs;
  char *glsl_vs;
  NegativeGLSL *this_local;
  
  glsl_fs = 
  "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
  ;
  pcStack_28 = 
  "#version 420 core\nlayout(location = 0) out uvec4 o_color[4];\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter0;\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter2;\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter0));\n  o_color[2] = uvec4(atomicCounterIncrement(ac_counter2));\n}"
  ;
  glsl_vs = (char *)this;
  GVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                    (&this->super_SACSubcaseBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out uvec4 o_color[4];\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter0;\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter2;\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter0));\n  o_color[2] = uvec4(atomicCounterIncrement(ac_counter2));\n}"
                     ,false);
  this->prog_ = GVar1;
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->prog_);
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->prog_,0x8b82,&local_2c);
  if (local_2c == 1) {
    gl4cts::anon_unknown_0::Output
              (
              "Link should fail because ac_counter0 and ac_counter2 uses same binding and same offset.\n"
              );
    this_local = (NegativeGLSL *)&DAT_ffffffffffffffff;
  }
  else {
    this_local = (NegativeGLSL *)0x0;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* glsl_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							  "  gl_Position = i_vertex;" NL "}";
		const char* glsl_fs = "#version 420 core" NL "layout(location = 0) out uvec4 o_color[4];" NL
							  "layout(binding = 0, offset = 4) uniform atomic_uint ac_counter0;" NL
							  "layout(binding = 0, offset = 4) uniform atomic_uint ac_counter2;" NL "void main() {" NL
							  "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter0));" NL
							  "  o_color[2] = uvec4(atomicCounterIncrement(ac_counter2));" NL "}";
		prog_ = CreateProgram(glsl_vs, NULL, NULL, NULL, glsl_fs, false);

		GLint status;
		glLinkProgram(prog_);
		glGetProgramiv(prog_, GL_LINK_STATUS, &status);
		if (status == GL_TRUE)
		{
			Output("Link should fail because ac_counter0 and ac_counter2 uses same binding and same offset.\n");
			return ERROR;
		}
		return NO_ERROR;
	}